

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O1

QVariant * __thiscall
AbstractStringSerialiserPrivate::loadVariant
          (QVariant *__return_storage_ptr__,AbstractStringSerialiserPrivate *this,int type,
          QString *val)

{
  storage_type_conflict *psVar1;
  double dVar2;
  QTime QVar3;
  long lVar4;
  longlong lVar5;
  QDate QVar6;
  ulonglong uVar7;
  ulong uVar8;
  ulong uVar9;
  char16_t *pcVar10;
  int type_00;
  uint uVar11;
  QImage *this_00;
  bool bVar12;
  float fVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QByteArray local_40;
  QArrayData *local_28;
  
  psVar1 = (storage_type_conflict *)(val->d).size;
  if (psVar1 == (storage_type_conflict *)0x0) {
switchD_00120220_caseD_0:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    return __return_storage_ptr__;
  }
  type_00 = (int)this;
  if (0x1000 < type) {
    if (type == 0x1001) {
      loadImageVariant((AbstractStringSerialiserPrivate *)&stack0xffffffffffffffd8,type_00,val);
      QPixmap::fromImageInPlace
                (&local_40,(AbstractStringSerialiserPrivate *)&stack0xffffffffffffffd8,0);
      QPixmap::operator_cast_to_QVariant(__return_storage_ptr__,(QPixmap *)&local_40);
      QPixmap::~QPixmap((QPixmap *)&local_40);
    }
    else {
      if (type == 0x1006) {
        loadImageVariant((AbstractStringSerialiserPrivate *)&local_40,type_00,val);
        QImage::operator_cast_to_QVariant(__return_storage_ptr__,(QImage *)&local_40);
        this_00 = (QImage *)&local_40;
        goto LAB_001205c9;
      }
      if (type != 0x1009) goto switchD_00120220_caseD_8;
      loadImageVariant((AbstractStringSerialiserPrivate *)&stack0xffffffffffffffd8,type_00,val);
      QBitmap::fromImage(&local_40,(AbstractStringSerialiserPrivate *)&stack0xffffffffffffffd8,0);
      QBitmap::operator_cast_to_QVariant(__return_storage_ptr__,(QBitmap *)&local_40);
      QPixmap::~QPixmap((QPixmap *)&local_40);
    }
    this_00 = (QImage *)&stack0xffffffffffffffd8;
LAB_001205c9:
    QImage::~QImage(this_00);
    return __return_storage_ptr__;
  }
  switch(type) {
  case 0:
    goto switchD_00120220_caseD_0;
  case 1:
    QVar21.m_data = (val->d).ptr;
    QVar21.m_size = (qsizetype)psVar1;
    lVar4 = QString::toIntegral_helper(QVar21,(bool *)0x0,10);
    ::QVariant::QVariant(__return_storage_ptr__,lVar4 == 1);
    break;
  case 2:
  case 0x20:
    QVar14.m_data = (val->d).ptr;
    QVar14.m_size = (qsizetype)psVar1;
    lVar4 = QString::toIntegral_helper(QVar14,(bool *)0x0,10);
    uVar11 = (uint)lVar4;
    if ((int)(uint)lVar4 != lVar4) {
      uVar11 = 0;
    }
    goto LAB_00120565;
  case 3:
  case 0x23:
    QVar16.m_data = (val->d).ptr;
    QVar16.m_size = (qsizetype)psVar1;
    uVar8 = QString::toIntegral_helper(QVar16,(bool *)0x0,10);
    uVar9 = 0;
    if (uVar8 < 0x100000000) {
      uVar9 = uVar8;
    }
    ::QVariant::QVariant(__return_storage_ptr__,(uint)uVar9);
    break;
  case 4:
    lVar5 = QString::toLongLong((bool *)val,0);
    ::QVariant::QVariant(__return_storage_ptr__,lVar5);
    break;
  case 5:
    uVar7 = QString::toULongLong((bool *)val,0);
    ::QVariant::QVariant(__return_storage_ptr__,uVar7);
    break;
  case 6:
    dVar2 = (double)QString::toDouble((bool *)val);
    ::QVariant::QVariant(__return_storage_ptr__,dVar2);
    break;
  case 7:
    ::QVariant::QVariant(__return_storage_ptr__,(QChar)*(val->d).ptr);
    break;
  default:
switchD_00120220_caseD_8:
    stringToVariant(__return_storage_ptr__,this,val);
    break;
  case 10:
    ::QVariant::QVariant(__return_storage_ptr__,val);
    break;
  case 0xc:
    QString::toLatin1_helper((QString *)&stack0xffffffffffffffd8);
    QByteArray::fromBase64(&local_40,(QString *)&stack0xffffffffffffffd8,0);
    ::QVariant::QVariant(__return_storage_ptr__,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,8);
      }
    }
    if (local_28 != (QArrayData *)0x0) {
      LOCK();
      (local_28->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_28,1,8);
      }
    }
    break;
  case 0xe:
    pcVar10 = (val->d).ptr;
    if (pcVar10 == (char16_t *)0x0) {
      pcVar10 = (char16_t *)&QString::_empty;
    }
    QVar20.m_data = pcVar10;
    QVar20.m_size = (qsizetype)psVar1;
    QVar6.jd = QDate::fromString(QVar20,ISODate);
    ::QVariant::QVariant(__return_storage_ptr__,QVar6);
    break;
  case 0xf:
    pcVar10 = (val->d).ptr;
    if (pcVar10 == (char16_t *)0x0) {
      pcVar10 = (char16_t *)&QString::_empty;
    }
    QVar19.m_data = pcVar10;
    QVar19.m_size = (qsizetype)psVar1;
    QVar3.mds = QTime::fromString(QVar19,ISODate);
    ::QVariant::QVariant(__return_storage_ptr__,QVar3);
    break;
  case 0x10:
    pcVar10 = (val->d).ptr;
    if (pcVar10 == (char16_t *)0x0) {
      pcVar10 = (char16_t *)&QString::_empty;
    }
    QVar22.m_data = psVar1;
    QVar22.m_size = (qsizetype)&local_40;
    QDateTime::fromString(QVar22,(DateFormat)pcVar10);
    ::QVariant::QVariant(__return_storage_ptr__,(QDateTime *)&local_40);
    QDateTime::~QDateTime((QDateTime *)&local_40);
    break;
  case 0x21:
    QVar18.m_data = (val->d).ptr;
    QVar18.m_size = (qsizetype)psVar1;
    lVar4 = QString::toIntegral_helper(QVar18,(bool *)0x0,10);
    bVar12 = (int)lVar4 == lVar4;
    uVar11 = (uint)(short)lVar4;
    goto LAB_00120361;
  case 0x22:
  case 0x28:
    QVar15.m_data = (val->d).ptr;
    QVar15.m_size = (qsizetype)psVar1;
    lVar4 = QString::toIntegral_helper(QVar15,(bool *)0x0,10);
    bVar12 = (int)lVar4 == lVar4;
    uVar11 = (uint)(char)lVar4;
LAB_00120361:
    if (!bVar12) {
      uVar11 = 0;
    }
    goto LAB_00120565;
  case 0x24:
    QVar17.m_data = (val->d).ptr;
    QVar17.m_size = (qsizetype)psVar1;
    uVar8 = QString::toIntegral_helper(QVar17,(bool *)0x0,10);
    uVar9 = 0;
    if (uVar8 < 0x100000000) {
      uVar9 = uVar8;
    }
    uVar11 = (uint)uVar9 & 0xffff;
    goto LAB_00120565;
  case 0x25:
    QVar23.m_data = (val->d).ptr;
    QVar23.m_size = (qsizetype)psVar1;
    uVar8 = QString::toIntegral_helper(QVar23,(bool *)0x0,10);
    uVar9 = 0;
    if (uVar8 < 0x100000000) {
      uVar9 = uVar8;
    }
    uVar11 = (uint)uVar9 & 0xff;
LAB_00120565:
    ::QVariant::QVariant(__return_storage_ptr__,uVar11);
    break;
  case 0x26:
    fVar13 = (float)QString::toFloat((bool *)val);
    ::QVariant::QVariant(__return_storage_ptr__,fVar13);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant AbstractStringSerialiserPrivate::loadVariant(int type, const QString &val) const
{
    if (val.isEmpty())
        return QVariant();
    switch (type) {
    case QMetaType::UnknownType:
        Q_ASSERT_X(false, "ModelSerialisation::loadVariant", "Trying to load unregistered type.");
        return QVariant();
    case QMetaType::Bool:
        return val.toInt() == 1;
    case QMetaType::Long:
    case QMetaType::Int:
        return val.toInt();
    case QMetaType::ULong:
    case QMetaType::UInt:
        return val.toUInt();
    case QMetaType::LongLong:
        return val.toLongLong();
    case QMetaType::ULongLong:
        return val.toULongLong();
    case QMetaType::Double:
        return val.toDouble();
    case QMetaType::Short:
        return static_cast<short>(val.toInt());
    case QMetaType::SChar:
    case QMetaType::Char:
        return static_cast<char>(val.toInt());
    case QMetaType::UShort:
        return static_cast<unsigned short>(val.toUInt());
    case QMetaType::UChar:
        return static_cast<unsigned char>(val.toUInt());
    case QMetaType::Float:
        return val.toFloat();
    case QMetaType::QChar:
        return val.at(0);
    case QMetaType::QString:
        return val;
    case QMetaType::QByteArray:
        return QByteArray::fromBase64(val.toLatin1());
    case QMetaType::QDate:
        return QDate::fromString(val, Qt::ISODate);
    case QMetaType::QTime:
        return QTime::fromString(val, Qt::ISODate);
    case QMetaType::QDateTime:
        return QDateTime::fromString(val, Qt::ISODate);
#ifdef QT_GUI_LIB
    case QMetaType::QImage:
        return loadImageVariant(type, val);
    case QMetaType::QPixmap:
        return QPixmap::fromImage(loadImageVariant(type, val));
    case QMetaType::QBitmap:
        return QBitmap::fromImage(loadImageVariant(type, val));
#endif
    default:
        return stringToVariant(val);
    }
}